

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,uncertain_measurement *measure,
          uint64_t match_flags)

{
  ostream *poVar1;
  uint64_t match_flags_00;
  float fVar2;
  double dVar3;
  long local_200;
  unit local_1e8;
  string local_1e0;
  long local_1b0;
  stringstream ss;
  ostream local_1a0 [376];
  long local_28;
  streamsize digits;
  uint64_t match_flags_local;
  uncertain_measurement *measure_local;
  
  digits = (streamsize)measure;
  match_flags_local = (uint64_t)this;
  measure_local = (uncertain_measurement *)__return_storage_ptr__;
  dVar3 = uncertain_measurement::fractional_uncertainty((uncertain_measurement *)this);
  dVar3 = log10(dVar3);
  match_flags_00 = 0x8000000000000000;
  dVar3 = ceil(-dVar3);
  if ((long)dVar3 < 2) {
    local_200 = 2;
  }
  else {
    local_200 = (long)dVar3 + 1;
  }
  local_28 = local_200;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::ios_base::precision((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),local_28);
  fVar2 = uncertain_measurement::value_f((uncertain_measurement *)match_flags_local);
  std::ostream::operator<<(local_1a0,fVar2);
  std::operator<<(local_1a0,"+/-");
  std::ios_base::precision((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),2);
  fVar2 = uncertain_measurement::uncertainty_f((uncertain_measurement *)match_flags_local);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a0,fVar2);
  std::operator<<(poVar1,' ');
  std::ios_base::precision((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),local_28);
  local_1e8 = uncertain_measurement::units((uncertain_measurement *)match_flags_local);
  to_string_abi_cxx11_(&local_1e0,(units *)&local_1e8,(unit *)digits,match_flags_00);
  std::operator<<(local_1a0,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
    to_string(const uncertain_measurement& measure, std::uint64_t match_flags)
{
    // compute the correct number of digits to display for uncertain precision
    auto digits = static_cast<std::streamsize>(
        ceil(-log10(measure.fractional_uncertainty())));
    digits = (digits < 2) ? 2 : digits + 1;
    std::stringstream ss;
    ss.precision(digits);
    ss << measure.value_f();
    ss << "+/-";
    ss.precision(2);
    ss << measure.uncertainty_f() << ' ';
    ss.precision(digits);
    ss << to_string(measure.units(), match_flags);
    return ss.str();
}